

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O1

size_t HUF_compressWeights(void *dst,size_t dstSize,void *weightTable,size_t wtSize)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  void *dst_00;
  ulong uVar5;
  U32 maxSymbolValue;
  S16 norm [13];
  U32 count [13];
  BYTE scratchBuffer [64];
  FSE_CTable CTable [59];
  uint local_1d4;
  void *local_1d0;
  short local_1c8 [16];
  uint local_1a8 [16];
  undefined1 local_168 [64];
  FSE_CTable local_128 [62];
  
  local_1d4 = 0xc;
  if (wtSize < 2) {
    sVar3 = 0;
  }
  else {
    uVar2 = HIST_count_simple(local_1a8,&local_1d4,weightTable,wtSize);
    uVar5 = (ulong)(uVar2 == wtSize);
    sVar3 = uVar5;
    if (uVar2 != wtSize && uVar2 != 1) {
      uVar2 = FSE_optimalTableLog(6,wtSize,local_1d4);
      sVar3 = FSE_normalizeCount(local_1c8,uVar2,local_1a8,wtSize,local_1d4);
      if (((sVar3 < 0xfffffffffffffff8) &&
          (local_1d0 = dst, sVar4 = FSE_writeNCount(dst,dstSize,local_1c8,local_1d4,uVar2),
          sVar3 = sVar4, sVar4 < 0xfffffffffffffff8)) &&
         (sVar3 = FSE_buildCTable_wksp(local_128,local_1c8,local_1d4,uVar2,local_168,0x40),
         sVar3 < 0xfffffffffffffff8)) {
        dst_00 = (void *)((long)local_1d0 + sVar4);
        sVar3 = FSE_compress_usingCTable(dst_00,dstSize - sVar4,weightTable,wtSize,local_128);
        if (sVar3 < 0xfffffffffffffff8) {
          if (sVar3 == 0) {
            bVar1 = false;
            sVar3 = 0;
          }
          else {
            dst_00 = (void *)((long)dst_00 + sVar3);
            bVar1 = true;
            sVar3 = uVar5;
          }
        }
        else {
          bVar1 = false;
        }
        if (bVar1) {
          sVar3 = (long)dst_00 - (long)local_1d0;
        }
      }
    }
  }
  return sVar3;
}

Assistant:

size_t HUF_compressWeights (void* dst, size_t dstSize, const void* weightTable, size_t wtSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    U32 maxSymbolValue = HUF_TABLELOG_MAX;
    U32 tableLog = MAX_FSE_TABLELOG_FOR_HUFF_HEADER;

    FSE_CTable CTable[FSE_CTABLE_SIZE_U32(MAX_FSE_TABLELOG_FOR_HUFF_HEADER, HUF_TABLELOG_MAX)];
    BYTE scratchBuffer[1<<MAX_FSE_TABLELOG_FOR_HUFF_HEADER];

    U32 count[HUF_TABLELOG_MAX+1];
    S16 norm[HUF_TABLELOG_MAX+1];

    /* init conditions */
    if (wtSize <= 1) return 0;  /* Not compressible */

    /* Scan input and build symbol stats */
    {   unsigned const maxCount = HIST_count_simple(count, &maxSymbolValue, weightTable, wtSize);   /* never fails */
        if (maxCount == wtSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;        /* each symbol present maximum once => not compressible */
    }

    tableLog = FSE_optimalTableLog(tableLog, wtSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, wtSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(hSize, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += hSize;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, sizeof(scratchBuffer)) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, weightTable, wtSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    return op-ostart;
}